

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O0

void wallet::wallet_crypto_tests::TestCrypter::TestDecrypt
               (CCrypter *crypt,span<const_unsigned_char,_18446744073709551615UL> ciphertext,
               span<const_unsigned_char,_18446744073709551615UL> correct_plaintext)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext_00;
  bool bVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
  in_RSI;
  long in_FS_OFFSET;
  CKeyingMaterial decrypted;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
  *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  const_string *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  const_string *in_stack_fffffffffffffee0;
  unit_test_log_t *in_stack_fffffffffffffee8;
  CKeyingMaterial *in_stack_ffffffffffffff00;
  CCrypter *in_stack_ffffffffffffff08;
  pointer in_stack_ffffffffffffff18;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff20;
  const_string local_c8;
  lazy_ostream local_b8;
  equal_coll_impl *in_stack_ffffffffffffff58;
  assertion_result local_90;
  __normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffea8);
  ciphertext_00._M_extent._M_extent_value = in_stack_ffffffffffffff20._M_extent_value;
  ciphertext_00._M_ptr = in_stack_ffffffffffffff18;
  CCrypter::Decrypt(in_stack_ffffffffffffff08,ciphertext_00,in_stack_ffffffffffffff00);
  bVar2 = std::span<const_unsigned_char,_18446744073709551615UL>::empty
                    ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffea8)
  ;
  if (!bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (unsigned_long)in_stack_fffffffffffffea8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffea8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed0);
      in_stack_fffffffffffffee0 = (const_string *)&stack0xffffffffffffffc0;
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffeb0);
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffee8 = (unit_test_log_t *)&stack0xffffffffffffffd8;
      std::span<const_unsigned_char,_18446744073709551615UL>::begin
                ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffeb0);
      std::span<const_unsigned_char,_18446744073709551615UL>::end
                ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffeb8);
      boost::test_tools::tt_detail::equal_coll_impl::operator()
                (in_stack_ffffffffffffff58,in_RSI,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffeb0,(char (*) [1])in_stack_fffffffffffffea8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (unsigned_long)in_stack_fffffffffffffea8);
      in_stack_fffffffffffffeb8 = "decrypted.end()";
      in_stack_fffffffffffffeb0 = "decrypted.begin()";
      in_stack_fffffffffffffea8 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
           &DAT_00000004;
      boost::test_tools::tt_detail::report_assertion
                (&local_90,&local_b8,&local_c8,0x37,CHECK,CHECK_EQUAL_COLL);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(in_stack_fffffffffffffea8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffea8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void TestDecrypt(const CCrypter& crypt, const std::span<const unsigned char> ciphertext,
                        const std::span<const unsigned char> correct_plaintext = {})
{
    CKeyingMaterial decrypted;
    crypt.Decrypt(ciphertext, decrypted);
    if (!correct_plaintext.empty()) {
        BOOST_CHECK_EQUAL_COLLECTIONS(decrypted.begin(), decrypted.end(), correct_plaintext.begin(), correct_plaintext.end());
    }
}